

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFieldTypesTests::TestDateTime_fromLocalTimeT::TestDateTime_fromLocalTimeT
          (TestDateTime_fromLocalTimeT *this)

{
  char *suiteName;
  TestDateTime_fromLocalTimeT *this_local;
  
  suiteName = SuiteFieldTypesTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"DateTime_fromLocalTimeT",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/FieldTypesTestCase.cpp"
             ,0x65);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestDateTime_fromLocalTimeT_00457ff0;
  return;
}

Assistant:

TEST(DateTime_fromLocalTimeT)
{
  time_t currTime;
  currTime = time(NULL);
  localtime(&currTime);

  FIX::DateTime nonFractionalDateTime;
  nonFractionalDateTime = FIX::DateTime::fromLocalTimeT(currTime);

  CHECK(nonFractionalDateTime.m_date > 0);
  CHECK(nonFractionalDateTime.m_time > 0);

  FIX::DateTime fractionalDateTime = FIX::DateTime::fromLocalTimeT(currTime,1,1);

  CHECK(fractionalDateTime.m_date > 0);
  CHECK(fractionalDateTime.m_time > 0);

}